

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flexfloat.c
# Opt level: O2

void flexfloat_sanitize(flexfloat_t *a)

{
  flexfloat_desc_t desc;
  double dVar1;
  byte bVar2;
  _Bool _Var3;
  ulong uVar4;
  double dVar5;
  ulong exp;
  ulong uVar6;
  uint_t uVar7;
  fp_t fVar8;
  byte bVar9;
  int iVar10;
  ulong uVar11;
  
  dVar1 = a->value;
  uVar4 = flexfloat_exp(a);
  if (((a->desc).exp_bits == '\v') && ((a->desc).frac_bits == '4')) {
    return;
  }
  bVar2 = (byte)((ulong)dVar1 >> 0x38);
  dVar5 = dVar1;
  exp = 0x7ff;
  if ((uVar4 != 0x7ff) && (exp = uVar4, (a->desc).frac_bits != '4')) {
    iVar10 = fegetround();
    if (iVar10 == 0x800) {
      _Var3 = true;
LAB_001359b5:
      _Var3 = flexfloat_inf_rounding(a,uVar4,(_Bool)(bVar2 >> 7),_Var3);
LAB_001359ba:
      if (_Var3 != false) {
        dVar5 = (double)flexfloat_rounding_value(a,uVar4,(_Bool)(bVar2 >> 7));
        a->value = dVar5 + dVar1;
      }
    }
    else {
      if (iVar10 == 0x400) {
        _Var3 = false;
        goto LAB_001359b5;
      }
      if (iVar10 == 0) {
        _Var3 = flexfloat_nearest_rounding(a,uVar4);
        goto LAB_001359ba;
      }
    }
    exp = flexfloat_exp(a);
    dVar5 = a->value;
  }
  desc = a->desc;
  uVar4 = ((ulong)dVar5 & 0xfffffffffffff) >> (0x34 - desc.frac_bits & 0x3f);
  if (((ulong)dVar5 & 0x7ff0000000000000) == 0) {
    fVar8 = (fp_t)((uVar4 << (0x34 - desc.frac_bits & 0x3f)) + ((ulong)dVar1 & 0x8000000000000000));
  }
  else {
    uVar11 = exp;
    if ((long)exp < 1) {
      uVar7 = flexfloat_denorm_frac(a,exp);
      if (uVar7 == 0) {
        fVar8 = (fp_t)((ulong)dVar1 & 0x8000000000000000);
        goto LAB_00135aaa;
      }
      if ((ushort)desc < 0x3400) {
        iVar10 = 1 - (int)exp;
        bVar9 = (byte)iVar10;
        uVar4 = (uVar4 >> (bVar9 & 0x3f)) << (bVar9 & 0x3f);
        if (0x33 < iVar10) {
          uVar4 = 0;
        }
      }
    }
    else {
      uVar6 = ~(-1L << (desc.exp_bits & 0x3f));
      uVar11 = uVar6;
      if ((exp != 0x7ff) && (uVar11 = exp, (long)uVar6 <= (long)exp)) {
        uVar11 = uVar6;
        uVar4 = 0;
      }
    }
    fVar8 = (fp_t)flexfloat_pack(desc,(_Bool)(bVar2 >> 7),uVar11,uVar4);
  }
LAB_00135aaa:
  a->value = fVar8;
  return;
}

Assistant:

void flexfloat_sanitize(flexfloat_t *a)
{
    bool sign;
    int_fast16_t exp;
    int_fast16_t inf_exp;
    uint_t frac;


    // Sign
    sign = flexfloat_sign(a);

    // Exponent
    exp = flexfloat_exp(a);

    // This case does not require to be sanitized (except for NaNs)
    if(a->desc.exp_bits  == NUM_BITS_EXP && a->desc.frac_bits == NUM_BITS_FRAC)
    {
#ifdef NAN_NORMALIZATION	    
        if(exp == INF_EXP && (CAST_TO_INT(a->value) & MASK_FRAC)) // NaN
        {
        // Sanitize to canonical NaN (positive sign, quiet bit set)
        sign = 0;
        frac = UINT_C(1) << a->desc.frac_bits-1;
        CAST_TO_INT(a->value) = flexfloat_pack(a->desc, sign, exp, frac);
        }
#endif
        return;
    }

    // printf("enter sanitize: 0x%016lx s%d e%d m0x%013lx\n", CAST_TO_INT(a->value), sign, exp, CAST_TO_INT(a->value)&MASK_FRAC);

#ifdef FLEXFLOAT_ROUNDING
    // In these cases no rounding is needed
    if (!(exp == INF_EXP  || a->desc.frac_bits == NUM_BITS_FRAC))
    {
#ifdef FLEXFLOAT_FLAGS
        // Inexact results raise an exception
        if(flexfloat_round_bit(a, exp) || flexfloat_sticky_bit(a, exp))
            feraiseexcept(FE_INEXACT);
        // As rounding uses FP operations, we don't want to tarnish the accrued flags
        fexcept_t flags;
        fegetexceptflag(&flags, FE_ALL_EXCEPT);
#endif
        // Rounding mode
        int mode = fegetround();
        if(mode == FE_TONEAREST && flexfloat_nearest_rounding(a, exp))
        {
            int_t rounding_value = flexfloat_rounding_value(a, exp, sign);
            a->value +=  CAST_TO_FP(rounding_value);
        }
        else if(mode == FE_UPWARD && flexfloat_inf_rounding(a, exp, sign, 1))
        {
            int_t rounding_value = flexfloat_rounding_value(a, exp, sign);
            a->value +=  CAST_TO_FP(rounding_value);
        }
        else if(mode == FE_DOWNWARD && flexfloat_inf_rounding(a, exp, sign, 0))
        {
            int_t rounding_value = flexfloat_rounding_value(a, exp, sign);
            a->value +=  CAST_TO_FP(rounding_value);
        }
#ifdef FLEXFLOAT_FLAGS
        // Restore flags from before
        fesetexceptflag(&flags, FE_ALL_EXCEPT);
#endif
        //a->value = a->value;
        __asm__ __volatile__ ("" ::: "memory");

        // Recompute exponent value after rounding
        exp = flexfloat_exp(a);
    }
#endif

    // Exponent of NaN and Inf (target format)
    inf_exp = flexfloat_inf_exp(a->desc);

    // Mantissa
    frac = flexfloat_frac(a);

    if(EXPONENT(CAST_TO_INT(a->value)) == 0) // Denorm backend format - represented format also denormal
    {
        CAST_TO_INT(a->value) = flexfloat_denorm_pack(a->desc, sign, frac);
        return;
    }

   if(exp <= 0) // Denormalized value in the target format (saved in normalized format in the backend value)
    {
#ifdef FLEXFLOAT_FLAGS
        // Raise the underflow exception
        feraiseexcept(FE_UNDERFLOW);
#endif
        uint_t denorm = flexfloat_denorm_frac(a, exp);
        if(denorm == 0) // value too low to be represented, return zero
        {
            CAST_TO_INT(a->value) = PACK(sign, 0, 0);
            return;
        }
        else if(a->desc.frac_bits < NUM_BITS_FRAC) // Remove additional precision
        {
            int shift = - exp + 1;
            if(shift < NUM_BITS_FRAC)
            {
              frac >>= shift;
              frac <<= shift;
            }
            else
            {
              frac = UINT_C(0);
            }
        }
    }
    else if(exp == INF_EXP && (CAST_TO_INT(a->value) & MASK_FRAC)) // NaN
    {
        exp  = inf_exp;
#ifdef NAN_NORMALIZATION	
        // Sanitize to canonical NaN (positive sign, quiet bit set)
        sign = 0;
        frac = UINT_C(1) << a->desc.frac_bits-1;
#endif	
    }
    else if(exp == INF_EXP) // Inf
    {
#ifdef FLEXFLOAT_FLAGS
        // Raise the proper overflow exception, unless a DIV/0 exception had occured
        if (!fetestexcept(FE_DIVBYZERO))
            feraiseexcept(FE_OVERFLOW | FE_INEXACT);
#endif
        exp = inf_exp;
    }
    else if(exp >= inf_exp) // Out of bounds for target format: set infinity
    {
#ifdef FLEXFLOAT_FLAGS
        // Raise the proper overflow exception
        feraiseexcept(FE_OVERFLOW | FE_INEXACT);
#endif
        exp = inf_exp;
        frac = UINT_C(0);
    }

    // printf("ENCODING: %d %d %lu\n", sign, exp, frac);
    CAST_TO_INT(a->value) = flexfloat_pack(a->desc, sign, exp, frac);
}